

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O3

void __thiscall vera::Pyramid::process(Pyramid *this,Fbo *_input)

{
  function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)> *this_00;
  Fbo *__args;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Fbo *__args_00;
  uint uVar4;
  int iVar5;
  Fbo *pFVar6;
  
  this_00 = &this->pass;
  __args = this->m_downs;
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,__args,_input,(Fbo *)0x0,0);
  uVar4 = this->m_depth;
  if (1 < uVar4) {
    pFVar6 = this->m_downs;
    uVar3 = 1;
    do {
      pFVar6 = pFVar6 + 1;
      std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
                (this_00,pFVar6,pFVar6 + -1,(Fbo *)0x0,(int)uVar3);
      uVar3 = uVar3 + 1;
      uVar4 = this->m_depth;
    } while (uVar3 < uVar4);
  }
  pFVar6 = this->m_ups;
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,pFVar6,__args + (uVar4 - 2),__args + (uVar4 - 1),uVar4 - 1);
  uVar1 = this->m_depth;
  uVar4 = uVar1 - 1;
  uVar3 = (ulong)uVar4;
  if (uVar4 < 2) {
    uVar3 = (ulong)uVar4;
  }
  else {
    __args_00 = this->m_ups;
    uVar2 = 1;
    iVar5 = -1;
    do {
      __args_00 = __args_00 + 1;
      std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
                (this_00,__args_00,__args + ((uVar1 + iVar5) - 2),__args_00 + -1,(int)uVar3 + iVar5)
      ;
      uVar2 = uVar2 + 1;
      uVar1 = this->m_depth;
      uVar3 = (ulong)(uVar1 - 1);
      iVar5 = iVar5 + -1;
    } while (uVar2 < uVar3);
  }
  std::function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)>::operator()
            (this_00,pFVar6 + uVar3,_input,pFVar6 + (uVar1 - 2),0);
  return;
}

Assistant:

void Pyramid::process(const vera::Fbo *_input) {
    unsigned int i;
    // Copy the input to the first downscale
    pass(&m_downs[0], _input, NULL, 0);

    // DOWNSCALE
    for (i = 1; i < m_depth; i++)
        pass(&m_downs[i], &(m_downs[i-1]), NULL, i);
    
    // Copy the last downscale to the first upscale
    pass(&m_ups[0], &(m_downs[m_depth-2]), &(m_downs[m_depth-1]), m_depth-1);
    
    // UPSCALE
    for (i = 1; i < m_depth-1; i++)
        pass(&m_ups[i], &(m_downs[m_depth-i-2]), &(m_ups[i-1]), m_depth-1-i);
    
    // Copy the last upscale to the output
    pass(&m_ups[m_depth-1], _input, &(m_ups[m_depth-2]), 0);
}